

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O2

CollectorResult __thiscall
Simple::Lib::ProtoSignal<bool_(),_Simple::CollectorWhile0<bool>_>::emit
          (ProtoSignal<bool_(),_Simple::CollectorWhile0<bool>_> *this)

{
  SignalLink *this_00;
  bool bVar1;
  SignalLink *this_01;
  CollectorResult CVar2;
  
  this_01 = this->callback_ring_;
  if (this_01 == (SignalLink *)0x0) {
    CVar2 = false;
  }
  else {
    SignalLink::incref(this_01);
    do {
      if ((this_01->function).super__Function_base._M_manager != (_Manager_type)0x0) {
        bVar1 = std::function<bool_()>::operator()(&this_01->function);
        if (bVar1) {
          CVar2 = true;
          goto LAB_0010c013;
        }
      }
      this_00 = this_01->next;
      SignalLink::incref(this_00);
      SignalLink::decref(this_01);
      this_01 = this_00;
    } while (this_00 != this->callback_ring_);
    CVar2 = false;
LAB_0010c013:
    SignalLink::decref(this_01);
  }
  return CVar2;
}

Assistant:

CollectorResult
  emit (Args... args)
  {
    Collector collector;
    if (!callback_ring_)
      return collector.result();
    SignalLink *link = callback_ring_;
    link->incref();
    do
      {
        if (link->function != nullptr)
          {
            const bool continue_emission = this->invoke (collector, link->function, args...);
            if (!continue_emission)
              break;
          }
        SignalLink *old = link;
        link = old->next;
        link->incref();
        old->decref();
      }
    while (link != callback_ring_);
    link->decref();
    return collector.result();
  }